

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quadtree.h
# Opt level: O0

int __thiscall
quadtree::
Quadtree<Node_*,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pvigier[P]Quadtree/examples/physics.cpp:64:19),_std::equal_to<Node_*>,_float>
::getQuadrant(Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
              *this,Box<float> *nodeBox,Box<float> *valueBox)

{
  float fVar1;
  Vector2<float> VVar2;
  float local_30;
  float fStack_2c;
  Vector2<float> center;
  Box<float> *valueBox_local;
  Box<float> *nodeBox_local;
  Quadtree<Node_*,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pvigier[P]Quadtree_examples_physics_cpp:64:19),_std::equal_to<Node_*>,_float>
  *this_local;
  
  VVar2 = Box<float>::getCenter(nodeBox);
  fVar1 = Box<float>::getRight(valueBox);
  local_30 = VVar2.x;
  fStack_2c = VVar2.y;
  if (local_30 <= fVar1) {
    if (valueBox->left < local_30) {
      this_local._4_4_ = -1;
    }
    else {
      fVar1 = Box<float>::getBottom(valueBox);
      if (fStack_2c <= fVar1) {
        if (valueBox->top < fStack_2c) {
          this_local._4_4_ = -1;
        }
        else {
          this_local._4_4_ = 3;
        }
      }
      else {
        this_local._4_4_ = 1;
      }
    }
  }
  else {
    fVar1 = Box<float>::getBottom(valueBox);
    if (fStack_2c <= fVar1) {
      if (valueBox->top < fStack_2c) {
        this_local._4_4_ = -1;
      }
      else {
        this_local._4_4_ = 2;
      }
    }
    else {
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

int getQuadrant(const Box<Float>& nodeBox, const Box<Float>& valueBox) const
    {
        auto center = nodeBox.getCenter();
        // West
        if (valueBox.getRight() < center.x)
        {
            // North West
            if (valueBox.getBottom() < center.y)
                return 0;
            // South West
            else if (valueBox.top >= center.y)
                return 2;
            // Not contained in any quadrant
            else
                return -1;
        }
        // East
        else if (valueBox.left >= center.x)
        {
            // North East
            if (valueBox.getBottom() < center.y)
                return 1;
            // South East
            else if (valueBox.top >= center.y)
                return 3;
            // Not contained in any quadrant
            else
                return -1;
        }
        // Not contained in any quadrant
        else
            return -1;
    }